

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
          (SubTypeIterator<glu::IsBasicType> *this,VarType *type)

{
  VarType *type_local;
  SubTypeIterator<glu::IsBasicType> *this_local;
  
  this->m_type = type;
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector(&this->m_path);
  if (this->m_type != (VarType *)0x0) {
    findNext(this);
  }
  return;
}

Assistant:

SubTypeIterator<IsExpanded>::SubTypeIterator (const VarType* type)
	: m_type(type)
{
	if (m_type)
		findNext();
}